

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

long duckdb::DatePart::PartOperator<duckdb::DatePart::ISODayOfWeekOperator>::
     Operation<duckdb::timestamp_t,long>
               (timestamp_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int64_t iVar2;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    iVar2 = ISODayOfWeekOperator::Operation<duckdb::timestamp_t,long>(input);
    return iVar2;
  }
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
  return 0;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}